

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O3

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::ChildPopper::popConstrainedChildren
          (Result<wasm::Ok> *__return_storage_ptr__,ChildPopper *this,
          vector<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
          *children)

{
  long *plVar1;
  Expression *pEVar2;
  Result<wasm::Ok> *pRVar3;
  HeapTypeKind HVar4;
  uint uVar5;
  ScopeCtx *pSVar6;
  Constraint *this_00;
  Expression *pEVar7;
  Type *pTVar8;
  Type right;
  HeapType HVar9;
  undefined1 *puVar10;
  size_t size;
  bool bVar11;
  undefined1 extraout_DL;
  size_t i;
  long lVar12;
  long lVar13;
  bool bVar14;
  _Uninitialized<wasm::Expression_*,_true> _Var15;
  long lVar16;
  bool bVar17;
  undefined1 local_d8 [8];
  Result<wasm::Expression_*> val;
  undefined8 local_a8;
  long local_a0;
  undefined8 uStack_98;
  ChildPopper *local_90;
  Result<wasm::Ok> *local_88;
  uintptr_t local_80;
  long local_78;
  undefined1 local_70 [8];
  Type type;
  __index_type local_50;
  
  local_90 = this;
  pSVar6 = getScope(this->builder);
  local_88 = __return_storage_ptr__;
  if (pSVar6->unreachable != true) {
    bVar14 = false;
LAB_00c91e38:
    uVar5 = (int)((ulong)((long)(children->
                                super__Vector_base<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(children->
                               super__Vector_base<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
                               )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555 - 1;
    if (-1 < (int)uVar5) {
      local_78 = local_78 + 1;
      lVar13 = (ulong)uVar5 * 0x18 + 8;
      lVar12 = (ulong)uVar5 + 1;
      do {
        if (((bVar14) && (lVar12 != 1)) &&
           ((long)(pSVar6->exprStack).
                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(pSVar6->exprStack).
                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3 == local_78)) {
          puVar10 = (undefined1 *)
                    MixedArena::allocSpace(&((local_90->builder->builder).wasm)->allocator,0x10,8);
          *puVar10 = 0x17;
          *(undefined8 *)(puVar10 + 8) = 1;
          **(undefined8 **)
            ((long)(children->
                   super__Vector_base<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
                   )._M_impl.super__Vector_impl_data._M_start + lVar13 + -8) = puVar10;
        }
        else {
          size = Constraint::size((Constraint *)
                                  ((long)&((children->
                                           super__Vector_base<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
                                           )._M_impl.super__Vector_impl_data._M_start)->childp +
                                  lVar13));
          pop((Result<wasm::Expression_*> *)local_d8,local_90,size);
          std::__detail::__variant::_Copy_ctor_base<false,_wasm::Expression_*,_wasm::Err>::
          _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Expression_*,_wasm::Err> *)local_70,
                          (_Copy_ctor_base<false,_wasm::Expression_*,_wasm::Err> *)local_d8);
          if (local_50 == '\x01') {
            val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
            super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
            super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
            super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
            super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._32_8_ = &local_a0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)
                       ((long)&val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                               super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20),
                       local_70,type.id + (long)local_70);
            pRVar3 = local_88;
            plVar1 = (long *)((long)&(local_88->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                                     super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
            *(long **)&(local_88->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::Err> = plVar1;
            if ((long *)val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                        super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._32_8_ ==
                &local_a0) {
              *plVar1 = local_a0;
              *(undefined8 *)
               ((long)&(local_88->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) = uStack_98;
            }
            else {
              *(undefined8 *)
               &(local_88->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::Err> =
                   val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                   super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._32_8_;
              *(long *)((long)&(local_88->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) = local_a0;
            }
            *(undefined8 *)
             ((long)&(local_88->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = local_a8;
            *(__index_type *)
             ((long)&(local_88->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
            std::__detail::__variant::_Variant_storage<false,_wasm::Expression_*,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::Expression_*,_wasm::Err> *)local_70);
            std::__detail::__variant::_Variant_storage<false,_wasm::Expression_*,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::Expression_*,_wasm::Err> *)local_d8);
            return pRVar3;
          }
          std::__detail::__variant::_Variant_storage<false,_wasm::Expression_*,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_wasm::Expression_*,_wasm::Err> *)local_70);
          (*(_Uninitialized<wasm::Expression_*,_true> **)
            ((long)(children->
                   super__Vector_base<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
                   )._M_impl.super__Vector_impl_data._M_start + lVar13 + -8))->_M_storage =
               (Expression *)local_d8;
          std::__detail::__variant::_Variant_storage<false,_wasm::Expression_*,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_wasm::Expression_*,_wasm::Err> *)local_d8);
        }
        lVar13 = lVar13 + -0x18;
        lVar16 = lVar12 + -1;
        bVar17 = 0 < lVar12;
        lVar12 = lVar16;
      } while (lVar16 != 0 && bVar17);
    }
    *(__index_type *)
     ((long)&(local_88->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
    return local_88;
  }
  lVar12 = (long)(pSVar6->exprStack).
                 super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(pSVar6->exprStack).
                 super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
                 .super__Vector_impl_data._M_start >> 3;
  bVar14 = false;
  this_00 = (Constraint *)0x0;
  _Var15._M_storage = (Expression *)0x0;
  lVar13 = ((long)(children->
                  super__Vector_base<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(children->
                  super__Vector_base<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  do {
    lVar16 = lVar13;
    if (this_00 == (Constraint *)0x0) {
      if (lVar13 == 0) {
        bVar14 = false;
        goto LAB_00c91e38;
      }
      lVar16 = lVar13 + -1;
      this_00 = (Constraint *)
                Constraint::size(&(children->
                                  super__Vector_base<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
                                  )._M_impl.super__Vector_impl_data._M_start[lVar13 + -1].constraint
                                );
    }
    this_00 = (Constraint *)
              ((long)&this_00[-1].
                      super_variant<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                      .
                      super__Variant_base<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                      .
                      super__Move_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                      .
                      super__Copy_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                      .
                      super__Move_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                      .
                      super__Copy_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                      .
                      super__Variant_storage_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
              + 0xf);
    do {
      pEVar7 = _Var15._M_storage;
      if (pEVar7 == (Expression *)0x0) {
        if (lVar12 == 0) goto LAB_00c91e2f;
        lVar13 = lVar12 + -1;
        lVar12 = lVar12 + -1;
        pEVar7 = (Expression *)
                 wasm::Type::size(&(pSVar6->exprStack).
                                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start[lVar13]->type);
      }
      pEVar2 = (pSVar6->exprStack).
               super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
               super__Vector_impl_data._M_start[lVar12];
      _Var15._M_storage = (Expression *)0x0;
    } while ((pEVar2->type).id == 0);
    local_d8 = (undefined1  [8])&pEVar2->type;
    _Var15._M_storage = (Expression *)((long)&pEVar7[-1].type.id + 7);
    val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
    super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
    super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
    super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
    super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._M_first._M_storage =
         (_Uninitialized<wasm::Expression_*,_true>)_Var15._M_storage;
    pTVar8 = wasm::Type::Iterator::operator*((Iterator *)local_d8);
    local_70 = (undefined1  [8])pTVar8->id;
    if (!bVar14) goto LAB_00c91e00;
    right.id = (uintptr_t)
               Constraint::operator[]
                         (&(children->
                           super__Vector_base<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
                           )._M_impl.super__Vector_impl_data._M_start[lVar16].constraint,this_00,i);
    switch(extraout_DL) {
    case 0:
      bVar17 = wasm::Type::isSubType((Type)local_70,right);
      if (bVar17) break;
      goto LAB_00c91e2f;
    case 1:
      break;
    case 2:
      if ((local_70 != (undefined1  [8])0x1) &&
         ((ulong)local_70 < (Expression *)0x7 || ((ulong)local_70 & 1) != 0)) goto LAB_00c91e2f;
      break;
    default:
      handle_unreachable("unexpected constraint",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-ir-builder.cpp"
                         ,0x1f6);
    case 4:
      if (((ulong)local_70 & 1) != 0 || (ulong)local_70 < (Expression *)0x7) goto LAB_00c91db3;
      val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
      super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._32_8_ =
           wasm::Type::getHeapType((Type *)local_70);
      HVar4 = HeapType::getKind((HeapType *)
                                ((long)&val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                                        super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                                        super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                                        super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                                        super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20
                                ));
      if (HVar4 != Array) goto LAB_00c91db3;
      local_80 = (uintptr_t)wasm::Type::getHeapType((Type *)local_70);
      HeapType::getArray((HeapType *)local_d8);
      bVar17 = val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
               super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
               super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
               super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
               super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._0_4_ == 1;
      goto LAB_00c91db6;
    case 5:
      if (((ulong)local_70 & 1) == 0 && (Expression *)0x6 < (ulong)local_70) {
        val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
        super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
        super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
        super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
        super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._32_8_ =
             wasm::Type::getHeapType((Type *)local_70);
        HVar4 = HeapType::getKind((HeapType *)
                                  ((long)&val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>
                                          .super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                                          super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                                          super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                                          super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> +
                                  0x20));
        if (HVar4 == Array) {
          local_80 = (uintptr_t)wasm::Type::getHeapType((Type *)local_70);
          HeapType::getArray((HeapType *)local_d8);
          bVar17 = val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                   super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._0_4_ == 2;
          goto LAB_00c91db6;
        }
      }
LAB_00c91db3:
      bVar17 = false;
LAB_00c91db6:
      if (((ulong)local_70 & 1) == 0 && (Expression *)0x6 < (ulong)local_70) {
        HVar9 = wasm::Type::getHeapType((Type *)local_70);
        bVar11 = ((uint)HVar9.id & 0x7b) == 0x58 && HVar9.id < 0x7d;
      }
      else {
        bVar11 = false;
      }
      if ((!bVar17 && !bVar11) && (local_70 != (undefined1  [8])0x1)) {
LAB_00c91e2f:
        bVar14 = true;
        goto LAB_00c91e38;
      }
    }
LAB_00c91e00:
    if (local_70 == (undefined1  [8])0x1) {
      local_78 = lVar12;
    }
    bVar14 = (bool)(bVar14 | local_70 == (undefined1  [8])0x1);
    lVar13 = lVar16;
  } while( true );
}

Assistant:

Result<> popConstrainedChildren(std::vector<Child>& children) {
    auto& scope = builder.getScope();

    // Two-part indices into the stack of available expressions and the vector
    // of requirements, allowing them to move independently with the granularity
    // of a single tuple element.
    size_t stackIndex = scope.exprStack.size();
    size_t stackTupleIndex = 0;
    size_t childIndex = children.size();
    size_t childTupleIndex = 0;

    // The index of the shallowest unreachable instruction on the stack.
    std::optional<size_t> unreachableIndex;

    // Whether popping the children past the unreachable would produce a type
    // mismatch or try to pop from an empty stack.
    bool needUnreachableFallback = false;

    if (!scope.unreachable) {
      // We only need to check requirements if there is an unreachable.
      // Otherwise the validator will catch any problems.
      goto pop;
    }

    // Check whether the values on the stack will be able to meet the given
    // requirements.
    while (true) {
      // Advance to the next requirement.
      if (childTupleIndex > 0) {
        --childTupleIndex;
      } else {
        if (childIndex == 0) {
          // We have examined all the requirements.
          break;
        }
        --childIndex;
        childTupleIndex = children[childIndex].constraint.size() - 1;
      }

      // Advance to the next available value on the stack.
      while (true) {
        if (stackTupleIndex > 0) {
          --stackTupleIndex;
        } else {
          if (stackIndex == 0) {
            // No more available values. This is valid iff we are reaching past
            // an unreachable, but we still need the fallback behavior to ensure
            // the input unreachable instruction is executed first. If we are
            // not reaching past an unreachable, the error will be caught when
            // we pop.
            needUnreachableFallback = true;
            goto pop;
          }
          --stackIndex;
          stackTupleIndex = scope.exprStack[stackIndex]->type.size() - 1;
        }

        // Skip expressions that don't produce values.
        if (scope.exprStack[stackIndex]->type == Type::none) {
          stackTupleIndex = 0;
          continue;
        }
        break;
      }

      // We have an available type and a constraint. Only check constraints if
      // we are past an unreachable, since otherwise we can leave problems to be
      // caught by the validator later.
      auto type = scope.exprStack[stackIndex]->type[stackTupleIndex];
      if (unreachableIndex) {
        auto constraint = children[childIndex].constraint[childTupleIndex];
        if (constraint.isAnyType()) {
          // Always succeeds.
        } else if (constraint.isAnyReference()) {
          if (!type.isRef() && type != Type::unreachable) {
            needUnreachableFallback = true;
            break;
          }
        } else if (auto bound = constraint.getSubtype()) {
          if (!Type::isSubType(type, *bound)) {
            needUnreachableFallback = true;
            break;
          }
        } else if (constraint.isAnyI8ArrayReference()) {
          bool isI8Array =
            type.isRef() && type.getHeapType().isArray() &&
            type.getHeapType().getArray().element.packedType == Field::i8;
          bool isNone =
            type.isRef() && type.getHeapType().isMaybeShared(HeapType::none);
          if (!isI8Array && !isNone && type != Type::unreachable) {
            needUnreachableFallback = true;
            break;
          }
        } else if (constraint.isAnyI16ArrayReference()) {
          bool isI16Array =
            type.isRef() && type.getHeapType().isArray() &&
            type.getHeapType().getArray().element.packedType == Field::i16;
          bool isNone =
            type.isRef() && type.getHeapType().isMaybeShared(HeapType::none);
          if (!isI16Array && !isNone && type != Type::unreachable) {
            needUnreachableFallback = true;
            break;
          }
        } else {
          WASM_UNREACHABLE("unexpected constraint");
        }
      }

      // No problems for children after this unreachable.
      if (type == Type::unreachable) {
        assert(!needUnreachableFallback);
        unreachableIndex = stackIndex;
      }
    }

  pop:
    // We have checked all the constraints, so we are ready to pop children.
    for (int i = children.size() - 1; i >= 0; --i) {
      if (needUnreachableFallback &&
          scope.exprStack.size() == *unreachableIndex + 1 && i > 0) {
        // The next item on the stack is the unreachable instruction we must
        // not pop past. We cannot insert unreachables in front of it because
        // it might be a branch we actually have to execute, so this next item
        // must be child 0. But we are not ready to pop child 0 yet, so
        // synthesize an unreachable instead of popping. The deeper
        // instructions that would otherwise have been popped will remain on
        // the stack to become prior children of future expressions or to be
        // implicitly dropped at the end of the scope.
        *children[i].childp = builder.builder.makeUnreachable();
        continue;
      }

      // Pop a child normally.
      auto val = pop(children[i].constraint.size());
      CHECK_ERR(val);
      *children[i].childp = *val;
    }
    return Ok{};
  }